

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CfgNode.h
# Opt level: O0

void __thiscall CfgNode::BlockData::~BlockData(BlockData *this)

{
  BlockData *this_local;
  
  (this->super_Data)._vptr_Data = (_func_int **)&PTR__BlockData_0013ba40;
  std::map<int,_CFG_*,_std::less<int>,_std::allocator<std::pair<const_int,_CFG_*>_>_>::~map
            (&this->m_signalHandlers);
  std::set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_>::~set(&this->m_calls);
  std::__cxx11::list<Instruction_*,_std::allocator<Instruction_*>_>::~list(&this->m_instrs);
  Data::~Data(&this->super_Data);
  return;
}

Assistant:

int size() const { return m_size; }